

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int binstr(const_bstring b1,int pos,const_bstring b2)

{
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  int iVar4;
  int local_5c;
  int local_58;
  uchar local_51;
  int i;
  uchar c1;
  uchar *d1;
  uchar c0;
  uchar *d0;
  int lf;
  int ll;
  int ii;
  int j;
  const_bstring b2_local;
  int pos_local;
  const_bstring b1_local;
  
  if ((((b1 == (const_bstring)0x0) || (b1->data == (uchar *)0x0)) || (b1->slen < 0)) ||
     (((b2 == (const_bstring)0x0 || (b2->data == (uchar *)0x0)) || (b2->slen < 0)))) {
    b1_local._4_4_ = -1;
  }
  else if (b1->slen == pos) {
    local_5c = pos;
    if (b2->slen != 0) {
      local_5c = -1;
    }
    b1_local._4_4_ = local_5c;
  }
  else if ((b1->slen < pos) || (pos < 0)) {
    b1_local._4_4_ = -1;
  }
  else {
    b1_local._4_4_ = pos;
    if (b2->slen != 0) {
      iVar4 = (b1->slen - b2->slen) + 1;
      if (pos < iVar4) {
        if ((b1->data == b2->data) && (pos == 0)) {
          b1_local._4_4_ = 0;
        }
        else {
          puVar3 = b1->data;
          iVar2 = b2->slen;
          uVar1 = *b2->data;
          local_58 = pos;
          if (iVar2 != 1) {
            ll = 0;
            iVar4 = b1->slen + -1;
            lf = -1;
            local_51 = uVar1;
            if (iVar4 <= pos) goto LAB_00196d53;
            do {
              if (local_51 == puVar3[local_58]) {
LAB_00196cdf:
                if (ll == 0) {
                  lf = local_58;
                }
                ll = ll + 1;
                local_58 = local_58 + 1;
                if (iVar2 <= ll) goto LAB_00196d18;
                local_51 = b2->data[ll];
              }
              else {
                if (local_51 == puVar3[local_58 + 1]) {
                  local_58 = local_58 + 1;
                  goto LAB_00196cdf;
                }
                local_58 = local_58 + 2;
              }
              while (iVar4 <= local_58) {
LAB_00196d53:
                if (((local_58 != iVar4) || (iVar2 != ll + 1)) || (local_51 != puVar3[local_58])) {
                  return -1;
                }
LAB_00196d18:
                if (local_58 == lf + ll) {
                  return lf;
                }
                local_58 = local_58 - ll;
                ll = 0;
                local_51 = uVar1;
              }
            } while( true );
          }
          for (; local_58 < iVar4; local_58 = local_58 + 1) {
            if (uVar1 == puVar3[local_58]) {
              return local_58;
            }
          }
          b1_local._4_4_ = -1;
        }
      }
      else {
        b1_local._4_4_ = -1;
      }
    }
  }
  return b1_local._4_4_;
}

Assistant:

int binstr (const_bstring b1, int pos, const_bstring b2) {
int j, ii, ll, lf;
unsigned char * d0;
unsigned char c0;
register unsigned char * d1;
register unsigned char c1;
register int i;

	if (b1 == NULL || b1->data == NULL || b1->slen < 0 ||
	    b2 == NULL || b2->data == NULL || b2->slen < 0) return BSTR_ERR;
	if (b1->slen == pos) return (b2->slen == 0)?pos:BSTR_ERR;
	if (b1->slen < pos || pos < 0) return BSTR_ERR;
	if (b2->slen == 0) return pos;

	/* No space to find such a string? */
	if ((lf = b1->slen - b2->slen + 1) <= pos) return BSTR_ERR;

	/* An obvious alias case */
	if (b1->data == b2->data && pos == 0) return 0;

	i = pos;

	d0 = b2->data;
	d1 = b1->data;
	ll = b2->slen;

	/* Peel off the b2->slen == 1 case */
	c0 = d0[0];
	if (1 == ll) {
		for (;i < lf; i++) if (c0 == d1[i]) return i;
		return BSTR_ERR;
	}

	c1 = c0;
	j = 0;
	lf = b1->slen - 1;

	ii = -1;
	if (i < lf) do {
		/* Unrolled current character test */
		if (c1 != d1[i]) {
			if (c1 != d1[1+i]) {
				i += 2;
				continue;
			}
			i++;
		}

		/* Take note if this is the start of a potential match */
		if (0 == j) ii = i;

		/* Shift the test character down by one */
		j++;
		i++;

		/* If this isn't past the last character continue */
		if (j < ll) {
			c1 = d0[j];
			continue;
		}

		N0:;

		/* If no characters mismatched, then we matched */
		if (i == ii+j) return ii;

		/* Shift back to the beginning */
		i -= j;
		j  = 0;
		c1 = c0;
	} while (i < lf);

	/* Deal with last case if unrolling caused a misalignment */
	if (i == lf && ll == j+1 && c1 == d1[i]) goto N0;

	return BSTR_ERR;
}